

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseDatalist(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *field_local;
  TidyDocImpl *doc_local;
  
  doc->lexer->insert = (IStack *)0x0;
  while( true ) {
    node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node_00 == (Node *)0x0) {
      prvTidyReport(doc,field,(Node *)0x0,0x25a);
      return;
    }
    if ((node_00->tag == field->tag) && (node_00->type == EndTag)) break;
    BVar1 = InsertMisc(field,node_00);
    if (BVar1 == no) {
      if ((node_00->type == StartTag) &&
         (((((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
            (node_00->tag->id == TidyTag_OPTION)) ||
           ((((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_OPTGROUP)) ||
            (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_DATALIST)))))) ||
          (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
           (node_00->tag->id == TidyTag_SCRIPT)))))) {
        prvTidyInsertNodeAtEnd(field,node_00);
        ParseTag(doc,node_00,IgnoreWhitespace);
      }
      else {
        prvTidyReport(doc,field,node_00,0x235);
        prvTidyFreeNode(doc,node_00);
      }
    }
  }
  prvTidyFreeNode(doc,node_00);
  field->closed = yes;
  TrimSpaces(doc,field);
  return;
}

Assistant:

void TY_(ParseDatalist)(TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_datalist = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;

    lexer->insert = NULL;  /* defer implicit inline start tags */
#if defined(ENABLE_DEBUG_LOG)
    in_parse_datalist++;
    SPRTF("Entering ParseDatalist %d...\n",in_parse_datalist);
#endif

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
#if defined(ENABLE_DEBUG_LOG)
            in_parse_datalist--;
            SPRTF("Exit ParseDatalist 1 %d...\n",in_parse_datalist);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag && 
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node)) 
           )
        {
            TY_(InsertNodeAtEnd)(field, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_datalist--;
    SPRTF("Exit ParseDatalist 2 %d...\n",in_parse_datalist);
#endif
}